

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

bool __thiscall wasm::Function::isParam(Function *this,Index index)

{
  size_t sVar1;
  Signature SVar2;
  Type local_20;
  
  SVar2 = HeapType::getSignature(&this->type);
  local_20 = SVar2.params.id;
  sVar1 = wasm::Type::size(&local_20);
  if ((ulong)index <
      ((long)(this->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) + sVar1) {
    return index < sVar1;
  }
  __assert_fail("index < size + vars.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm.cpp"
                ,0x4f8,"bool wasm::Function::isParam(Index)");
}

Assistant:

bool Function::isParam(Index index) {
  size_t size = getParams().size();
  assert(index < size + vars.size());
  return index < size;
}